

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall lest::got::got(got *this,location *where_,text *expr_,text *excpt_)

{
  allocator<char> local_a1;
  text local_a0;
  text local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  location local_40;
  
  std::operator+(&local_60,"passed: got exception ",excpt_);
  location::location(&local_40,where_);
  std::__cxx11::string::string((string *)&local_80,(string *)expr_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  success::success(&this->super_success,&local_60,&local_40,&local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  *(undefined ***)&(this->super_success).super_message = &PTR__message_0017ad48;
  return;
}

Assistant:

got( location where_, text expr_, text excpt_)
    : success( "passed: got exception " + excpt_, where_, expr_) {}